

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plannerbase.cpp
# Opt level: O1

void __thiscall
despot::PlannerBase::OptionParse
          (PlannerBase *this,Option *options,int *num_runs,string *world_type,string *belief_type,
          int *time_limit,string *solver_type,bool *search_solver)

{
  char *pcVar1;
  char *pcVar2;
  undefined1 auVar3 [16];
  int iVar4;
  long lVar5;
  timeval tv;
  timeval local_40;
  
  if (options[0x19].desc != (Descriptor *)0x0) {
    DAT_00193e30 = 1;
  }
  if (options[4].desc != (Descriptor *)0x0) {
    DAT_00193de0 = atoi(options[4].arg);
  }
  if (options[5].desc != (Descriptor *)0x0) {
    DAT_00193de8 = atof(options[5].arg);
  }
  if (options[8].desc == (Descriptor *)0x0) {
    gettimeofday(&local_40,(__timezone_ptr_t)0x0);
    lVar5 = (long)((double)local_40.tv_usec / 1000000.0 + (double)local_40.tv_sec) * 1000;
    auVar3 = SEXT816(lVar5) * SEXT816(0x112e0be826d694b3);
    DAT_00193e00 = (int)lVar5 +
                   ((int)(auVar3._8_8_ >> 0x1a) - (auVar3._12_4_ >> 0x1f)) * -1000000000;
  }
  else {
    DAT_00193e00 = atoi(options[8].arg);
  }
  if (options[9].desc != (Descriptor *)0x0) {
    Globals::config = atof(options[9].arg);
  }
  if (options[10].desc != (Descriptor *)0x0) {
    DAT_00193ddc = atoi(options[10].arg);
  }
  if (options[0xb].desc != (Descriptor *)0x0) {
    DAT_00193df0 = atof(options[0xb].arg);
  }
  if (options[0xc].desc != (Descriptor *)0x0) {
    DAT_00193df8 = atof(options[0xc].arg);
  }
  if (options[0xd].desc != (Descriptor *)0x0) {
    DAT_00193dd8 = atoi(options[0xd].arg);
  }
  if (options[0xe].desc != (Descriptor *)0x0) {
    pcVar1 = options[0xe].arg;
    pcVar2 = (char *)world_type->_M_string_length;
    strlen(pcVar1);
    std::__cxx11::string::_M_replace((ulong)world_type,0,pcVar2,(ulong)pcVar1);
  }
  if (options[0xf].desc != (Descriptor *)0x0) {
    DAT_00193de4 = atoi(options[0xf].arg);
  }
  pcVar1 = DAT_00193e10;
  if (options[0x10].desc != (Descriptor *)0x0) {
    pcVar2 = options[0x10].arg;
    strlen(pcVar2);
    std::__cxx11::string::_M_replace(0x193e08,0,pcVar1,(ulong)pcVar2);
  }
  if (options[0x11].desc != (Descriptor *)0x0) {
    iVar4 = atoi(options[0x11].arg);
    *num_runs = iVar4;
  }
  if (options[0x16].desc != (Descriptor *)0x0) {
    pcVar1 = options[0x16].arg;
    pcVar2 = (char *)belief_type->_M_string_length;
    strlen(pcVar1);
    std::__cxx11::string::_M_replace((ulong)belief_type,0,pcVar2,(ulong)pcVar1);
  }
  if (options[0x1b].desc != (Descriptor *)0x0) {
    iVar4 = atoi(options[0x1b].arg);
    *time_limit = iVar4;
  }
  if (options[0x1c].desc != (Descriptor *)0x0) {
    DAT_00193e28 = atof(options[0x1c].arg);
  }
  *search_solver = options[0x1d].desc != (Descriptor *)0x0;
  if (options[0x1a].desc != (Descriptor *)0x0) {
    pcVar1 = options[0x1a].arg;
    pcVar2 = (char *)solver_type->_M_string_length;
    strlen(pcVar1);
    std::__cxx11::string::_M_replace((ulong)solver_type,0,pcVar2,(ulong)pcVar1);
  }
  if (options[0x18].desc == (Descriptor *)0x0) {
    iVar4 = 0;
  }
  else {
    iVar4 = atoi(options[0x18].arg);
  }
  logging::level(iVar4);
  return;
}

Assistant:

void PlannerBase::OptionParse(option::Option *options, int &num_runs,
		string &world_type, string &belief_type, int &time_limit,
		string &solver_type, bool &search_solver) {
	if (options[E_SILENCE])
		Globals::config.silence = true;

	if (options[E_DEPTH])
		Globals::config.search_depth = atoi(options[E_DEPTH].arg);

	if (options[E_DISCOUNT])
		Globals::config.discount = atof(options[E_DISCOUNT].arg);

	if (options[E_SEED])
		Globals::config.root_seed = atoi(options[E_SEED].arg);
	else { // last 9 digits of current time in milli second
		long millis = (long) get_time_second() * 1000;
		long range = (long) pow((double) 10, (int) 9);
		Globals::config.root_seed = (unsigned int) (millis
				- (millis / range) * range);
	}

	if (options[E_TIMEOUT])
		Globals::config.time_per_move = atof(options[E_TIMEOUT].arg);

	if (options[E_NUMPARTICLES])
		Globals::config.num_scenarios = atoi(options[E_NUMPARTICLES].arg);

	if (options[E_PRUNE])
		Globals::config.pruning_constant = atof(options[E_PRUNE].arg);

	if (options[E_GAP])
		Globals::config.xi = atof(options[E_GAP].arg);

	if (options[E_SIM_LEN])
		Globals::config.sim_len = atoi(options[E_SIM_LEN].arg);

	if (options[E_WORLD])
		world_type = options[E_WORLD].arg;

	if (options[E_MAX_POLICY_SIM_LEN])
		Globals::config.max_policy_sim_len = atoi(
				options[E_MAX_POLICY_SIM_LEN].arg);

	if (options[E_DEFAULT_ACTION])
		Globals::config.default_action = options[E_DEFAULT_ACTION].arg;

	if (options[E_RUNS])
		num_runs = atoi(options[E_RUNS].arg);

	if (options[E_BELIEF])
		belief_type = options[E_BELIEF].arg;

	if (options[E_TIME_LIMIT])
		time_limit = atoi(options[E_TIME_LIMIT].arg);

	if (options[E_NOISE])
		Globals::config.noise = atof(options[E_NOISE].arg);

	search_solver = options[E_SEARCH_SOLVER];

	if (options[E_SOLVER])
		solver_type = options[E_SOLVER].arg;

	int verbosity = 0;
	if (options[E_VERBOSITY])
		verbosity = atoi(options[E_VERBOSITY].arg);
	logging::level(verbosity);
}